

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O0

int __thiscall ncnn::Pooling3D::forward(Pooling3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float *pfVar11;
  undefined8 *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar12;
  float val_2;
  int l_1;
  float sum_3;
  float *sptr_1;
  int j_5;
  int i_7;
  int z_5;
  float *outptr_4;
  Mat m_12;
  int q_6;
  float val_1;
  int sx;
  int kj;
  int sy;
  int ki;
  int sz;
  int kd;
  int area;
  float sum_2;
  int sx0;
  int j_4;
  int sy0;
  int i_6;
  int sz0;
  int z_4;
  float *outptr_3;
  Mat m_9;
  int q_5;
  int dtailpad;
  int htailpad;
  int wtailpad;
  float val;
  int l;
  float max_value_2;
  float *sptr;
  int j_3;
  int i_5;
  int z_3;
  float *outptr_2;
  Mat m_6;
  int q_4;
  int j_2;
  int i_4;
  int z_2;
  int gap1;
  int gap0;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outd;
  int outh;
  int outw;
  Option opt_pad;
  Mat bottom_blob_bordered;
  int iw_1;
  int ih_1;
  int id_1;
  float sum_1;
  int wk;
  int iw1_1;
  int iw0_1;
  int j_1;
  int hk;
  int ih1_1;
  int ih0_1;
  int i_3;
  int dk;
  int id1_1;
  int id0_1;
  int z_1;
  float *outptr_1;
  float *inptr_1;
  int q_3;
  int iw;
  int ih;
  int id;
  float max_value_1;
  int iw1;
  int iw0;
  int j;
  int ih1;
  int ih0;
  int i_2;
  int id1;
  int id0;
  int z;
  float *outptr;
  float *inptr;
  int q_2;
  int _out_d;
  int _out_h;
  int _out_w;
  int i_1;
  float sum;
  float *ptr_1;
  int q_1;
  int i;
  float max_value;
  float *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_4;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_14;
  Mat *m_13;
  Mat *m_11;
  Mat *m_10;
  Mat *m_8;
  Mat *m_7;
  Mat *m_5;
  Mat *m_3;
  Allocator *in_stack_ffffffffffffea28;
  allocator_type *in_stack_ffffffffffffea30;
  Mat *pMVar13;
  size_type in_stack_ffffffffffffea38;
  Mat *in_stack_ffffffffffffea40;
  Allocator *in_stack_ffffffffffffeaa0;
  undefined7 in_stack_ffffffffffffebc8;
  undefined1 in_stack_ffffffffffffebcf;
  Mat *in_stack_ffffffffffffebd8;
  Pooling3D *in_stack_ffffffffffffebe0;
  int local_1364;
  int local_1360;
  int local_135c;
  int local_12e8;
  float local_12e4;
  undefined8 local_12e0;
  undefined8 local_12d8;
  undefined8 local_12d0;
  undefined4 local_12c8;
  Allocator *local_12c0;
  undefined4 local_12b8;
  undefined4 local_12b4;
  undefined4 local_12b0;
  undefined4 local_12ac;
  undefined4 local_12a8;
  undefined8 local_12a0;
  long local_1298;
  int local_128c;
  int local_1288;
  int local_1284;
  undefined8 local_1280;
  undefined8 local_1278;
  undefined8 local_1270;
  undefined4 local_1268;
  long local_1260;
  undefined4 local_1258;
  undefined4 local_1254;
  undefined4 local_1250;
  undefined4 local_124c;
  undefined4 local_1248;
  undefined8 local_1240;
  long local_1238;
  undefined8 local_1230;
  undefined8 local_1228;
  undefined8 local_1220;
  undefined4 local_1218;
  Allocator *local_1210;
  undefined4 local_1208;
  undefined4 local_1204;
  undefined4 local_1200;
  undefined4 local_11fc;
  undefined4 local_11f8;
  undefined8 local_11f0;
  int local_11e4;
  undefined8 local_11e0;
  undefined8 local_11d8;
  undefined8 local_11d0;
  undefined4 local_11c8;
  Allocator *local_11c0;
  undefined4 local_11b8;
  undefined4 local_11b4;
  undefined4 local_11b0;
  undefined4 local_11ac;
  undefined4 local_11a8;
  undefined8 local_11a0;
  float local_1194;
  int local_1190;
  int local_118c;
  int local_1188;
  int local_1184;
  int local_1180;
  int local_117c;
  int local_1178;
  float local_1174;
  int local_1170;
  int local_116c;
  int local_1168;
  int local_1164;
  int local_1160;
  int local_115c;
  undefined8 local_1158;
  undefined8 local_1150;
  undefined8 local_1148;
  undefined4 local_1140;
  long local_1138;
  undefined4 local_1130;
  undefined4 local_112c;
  undefined4 local_1128;
  undefined4 local_1124;
  undefined4 local_1120;
  undefined8 local_1118;
  long local_1110;
  undefined8 local_1108;
  undefined8 local_1100;
  undefined8 local_10f8;
  undefined4 local_10f0;
  Allocator *local_10e8;
  undefined4 local_10e0;
  undefined4 local_10dc;
  undefined4 local_10d8;
  undefined4 local_10d4;
  undefined4 local_10d0;
  undefined8 local_10c8;
  int local_10bc;
  int local_10b8;
  int local_10b4;
  int local_10b0;
  float local_10ac;
  int local_10a8;
  float local_10a4;
  undefined8 local_10a0;
  undefined8 local_1098;
  undefined8 local_1090;
  undefined4 local_1088;
  Allocator *local_1080;
  undefined4 local_1078;
  undefined4 local_1074;
  undefined4 local_1070;
  undefined4 local_106c;
  undefined4 local_1068;
  undefined8 local_1060;
  float *local_1058;
  int local_104c;
  int local_1048;
  int local_1044;
  undefined8 local_1040;
  undefined8 local_1038;
  undefined8 local_1030;
  undefined4 local_1028;
  long local_1020;
  undefined4 local_1018;
  undefined4 local_1014;
  undefined4 local_1010;
  undefined4 local_100c;
  undefined4 local_1008;
  undefined8 local_1000;
  long local_ff8;
  void *local_ff0;
  int *local_fe8;
  ulong local_fe0;
  int local_fd8;
  Allocator *local_fd0;
  int local_fc8;
  int local_fc4;
  int local_fc0;
  undefined4 local_fbc;
  int local_fb8;
  ulong local_fb0;
  int local_fa8;
  int local_fa4;
  int local_fa0;
  int local_f9c;
  int local_f98;
  int local_f94;
  int local_f90;
  int local_f8c;
  reference local_f88;
  vector<int,_std::allocator<int>_> local_f78;
  int local_f5c;
  int local_f58;
  int local_f54;
  int local_f50;
  undefined4 local_f4c;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  ulong local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  Mat local_f08;
  int local_ec0;
  int local_ebc;
  int local_eb8;
  float local_eb4;
  int local_ea4;
  int local_e94;
  int local_e84;
  long local_e38;
  int local_de0;
  int local_ddc;
  int local_dd8;
  int local_dd4;
  float local_dd0;
  int local_dcc;
  int local_dc8;
  int local_dc4;
  int local_dc0;
  int local_dbc;
  int local_db8;
  int local_db4;
  int local_db0;
  int local_dac;
  undefined8 local_da8;
  undefined8 local_da0;
  undefined8 local_d98;
  undefined4 local_d90;
  long local_d88;
  undefined4 local_d80;
  undefined4 local_d7c;
  undefined4 local_d78;
  undefined4 local_d74;
  undefined4 local_d70;
  undefined8 local_d68;
  long local_d60;
  undefined8 local_d58;
  undefined8 local_d50;
  undefined8 local_d48;
  undefined4 local_d40;
  long local_d38;
  undefined4 local_d30;
  undefined4 local_d2c;
  undefined4 local_d28;
  undefined4 local_d24;
  undefined4 local_d20;
  undefined8 local_d18;
  long local_d10;
  int local_d08;
  int local_d04;
  int local_d00;
  int local_cfc;
  int local_cf8;
  float local_cf4;
  int local_ca0;
  int local_c9c;
  float local_c98 [4];
  undefined8 local_c88;
  undefined8 local_c80;
  undefined8 local_c78;
  undefined4 local_c70;
  long local_c68;
  undefined4 local_c60;
  undefined4 local_c5c;
  undefined4 local_c58;
  undefined4 local_c54;
  undefined4 local_c50;
  undefined8 local_c48;
  float *local_c40;
  int local_c38;
  int local_c34;
  long local_c30;
  int local_c28;
  int local_c24;
  int local_c20;
  int local_c1c;
  long *local_c10;
  long *local_c08;
  int local_bf4;
  long *local_bf0;
  Mat *local_be8;
  long *local_be0;
  long *local_bd8;
  undefined1 local_bb5;
  int local_bb4;
  undefined8 *local_ba8;
  undefined1 local_b85;
  int local_b84;
  undefined8 *local_b78;
  undefined8 *local_b68;
  undefined8 *local_b58;
  undefined8 *local_b30;
  undefined8 *local_b10;
  undefined8 *local_b00;
  undefined8 *local_ad0;
  undefined8 *local_ac0;
  void **local_ab0;
  undefined8 *local_aa0;
  undefined8 *local_a90;
  undefined8 *local_a80;
  undefined8 *local_a70;
  undefined8 *local_a60;
  undefined8 *local_a50;
  Mat *local_a40;
  long local_a20;
  int local_a10;
  undefined4 local_a0c;
  long *local_a08;
  undefined1 local_9ed;
  int local_9ec;
  undefined8 *local_9e0;
  undefined1 local_9cd;
  int local_9cc;
  Mat *local_9c8;
  undefined8 *local_9c0;
  undefined1 local_9ad;
  int local_9ac;
  undefined8 *local_9a0;
  undefined1 local_98d;
  int local_98c;
  Mat *local_988;
  undefined8 *local_980;
  undefined1 local_96d;
  int local_96c;
  undefined8 *local_960;
  undefined1 local_94d;
  int local_94c;
  Mat *local_948;
  void **local_940;
  undefined1 local_90d;
  int local_90c;
  undefined8 *local_900;
  undefined8 *local_8f0;
  undefined8 *local_8e8;
  undefined8 *local_8e0;
  undefined8 *local_8d0;
  Mat *local_8c8;
  int local_8bc;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  int local_8a4;
  undefined8 *local_8a0;
  undefined8 *local_898;
  int local_88c;
  void **local_888;
  undefined8 *local_880;
  int local_874;
  undefined8 *local_870;
  int local_864;
  undefined8 *local_860;
  int local_854;
  undefined8 *local_850;
  long *local_848;
  long *local_840;
  Mat *local_838;
  long *local_830;
  long local_828;
  undefined4 local_81c;
  long local_818;
  long local_810;
  undefined4 local_804;
  int local_800;
  int local_7fc;
  undefined8 *local_7f8;
  Allocator *local_7b8;
  int local_7ac;
  ulong local_7a8;
  void *local_7a0;
  void **local_788;
  long local_780;
  undefined4 local_774;
  long local_770;
  long local_768;
  undefined4 local_75c;
  int local_758;
  int local_754;
  undefined8 *local_750;
  Allocator *local_748;
  int local_73c;
  ulong local_738;
  void *local_730;
  undefined8 *local_718;
  long local_710;
  undefined4 local_704;
  long local_700;
  long local_6f8;
  undefined4 local_6ec;
  int local_6e8;
  int local_6e4;
  undefined8 *local_6e0;
  Allocator *local_6d8;
  int local_6cc;
  ulong local_6c8;
  void *local_6c0;
  undefined8 *local_6a8;
  long local_6a0;
  undefined4 local_694;
  long local_690;
  long local_688;
  undefined4 local_67c;
  int local_678;
  int local_674;
  undefined8 *local_670;
  long local_668;
  undefined4 local_65c;
  long local_658;
  float *local_650;
  undefined4 local_644;
  int local_640;
  int local_63c;
  undefined8 *local_638;
  long local_5f8;
  undefined4 local_5ec;
  long local_5e8;
  long local_5e0;
  undefined4 local_5d4;
  int local_5d0;
  int local_5cc;
  undefined8 *local_5c8;
  undefined4 local_574;
  long local_570;
  undefined4 local_554;
  long local_550;
  undefined4 local_544;
  long local_540;
  undefined4 local_534;
  long local_530;
  undefined4 local_524;
  long local_520;
  undefined4 local_514;
  long local_510;
  undefined4 local_504;
  long local_500;
  undefined4 local_4f4;
  long local_4f0;
  undefined4 local_4d4;
  long local_4d0;
  int local_448;
  undefined4 local_444;
  int local_428;
  undefined4 local_424;
  Mat *local_420;
  undefined8 *local_400;
  undefined8 *local_3e0;
  undefined8 *local_3c0;
  undefined8 *local_3a0;
  undefined8 *local_380;
  undefined8 *local_360;
  int local_348;
  undefined4 local_344;
  void **local_340;
  undefined8 *local_320;
  undefined8 *local_300;
  undefined8 *local_2a0;
  undefined8 *local_280;
  undefined8 *local_240;
  void *local_158;
  void *local_e8;
  void *local_d8;
  Allocator *local_90;
  int local_84;
  ulong local_80;
  void *local_78;
  int local_70;
  int local_6c;
  undefined8 *local_68;
  Allocator *local_60;
  int local_54;
  ulong local_50;
  void *local_48;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  Allocator *local_30;
  int local_24;
  ulong local_20;
  void *local_18;
  int local_10;
  int local_c;
  undefined8 *local_8;
  
  local_c1c = *(int *)((long)in_RSI + 0x2c);
  local_c20 = (int)in_RSI[6];
  local_c24 = *(int *)((long)in_RSI + 0x34);
  local_c28 = (int)in_RSI[7];
  local_c30 = in_RSI[2];
  iVar5 = (int)(in_stack_ffffffffffffea38 >> 0x20);
  local_c10 = in_RDX;
  local_c08 = in_RSI;
  if (*(int *)(in_RDI + 0x104) == 0) {
    if (*(int *)(in_RDI + 0x110) == 0) {
      local_8c8 = &local_f08;
      local_f08.data = (void *)0x0;
      local_f08.refcount = (int *)0x0;
      local_f08.elemsize = 0;
      local_f08.elempack = 0;
      local_f08.allocator = (Allocator *)0x0;
      local_f08.dims = 0;
      local_f08.w = 0;
      local_f08.h = 0;
      local_f08.d = 0;
      local_f08.c = 0;
      local_f08.cstep = 0;
      local_f48 = *in_RCX;
      uStack_f40 = in_RCX[1];
      local_f38 = in_RCX[2];
      uStack_f30 = in_RCX[3];
      uStack_f20 = in_RCX[5];
      local_f18 = in_RCX[6];
      uStack_f10 = in_RCX[7];
      local_f28 = in_RCX[4] & 0xffffffffffffff;
      make_padding(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8,local_8c8,
                   (Option *)CONCAT17(in_stack_ffffffffffffebcf,in_stack_ffffffffffffebc8));
      local_be8 = &local_f08;
      if (local_f08.data != (void *)0x0) {
        local_838 = local_be8;
      }
      if (local_f08.data != (void *)0x0 && local_f08.cstep * (long)local_f08.c != 0) {
        local_c1c = local_f08.w;
        local_c20 = local_f08.h;
        local_c24 = local_f08.d;
        local_f50 = (local_f08.w - *(int *)(in_RDI + 0xd4)) / *(int *)(in_RDI + 0xe0) + 1;
        local_f54 = (local_f08.h - *(int *)(in_RDI + 0xd8)) / *(int *)(in_RDI + 0xe4) + 1;
        local_f58 = (local_f08.d - *(int *)(in_RDI + 0xdc)) / *(int *)(in_RDI + 0xe8) + 1;
        Mat::create(in_stack_ffffffffffffea40,(int)(in_stack_ffffffffffffea38 >> 0x20),
                    (int)in_stack_ffffffffffffea38,(int)((ulong)in_stack_ffffffffffffea30 >> 0x20),
                    (int)in_stack_ffffffffffffea30,(size_t)in_stack_ffffffffffffea28,
                    in_stack_ffffffffffffeaa0);
        local_bf0 = local_c10;
        bVar12 = true;
        if (*local_c10 != 0) {
          local_830 = local_c10;
          bVar12 = local_c10[8] * (long)(int)local_c10[7] == 0;
        }
        if (bVar12) {
          local_bf4 = -100;
          local_f4c = 1;
        }
        else {
          local_f5c = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8) * *(int *)(in_RDI + 0xdc);
          std::allocator<int>::allocator((allocator<int> *)0x1d41d5d);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea40,
                     in_stack_ffffffffffffea38,in_stack_ffffffffffffea30);
          std::allocator<int>::~allocator((allocator<int> *)0x1d41d89);
          local_f88 = std::vector<int,_std::allocator<int>_>::operator[](&local_f78,0);
          local_f8c = 0;
          local_f90 = 0;
          local_f94 = local_c1c - *(int *)(in_RDI + 0xd4);
          local_f98 = local_c20 * local_c1c - local_c1c * *(int *)(in_RDI + 0xd8);
          for (local_f9c = 0; local_f9c < *(int *)(in_RDI + 0xdc); local_f9c = local_f9c + 1) {
            for (local_fa0 = 0; local_fa0 < *(int *)(in_RDI + 0xd8); local_fa0 = local_fa0 + 1) {
              for (local_fa4 = 0; local_fa4 < *(int *)(in_RDI + 0xd4); local_fa4 = local_fa4 + 1) {
                local_f88[local_f8c] = local_f90;
                local_f8c = local_f8c + 1;
                local_f90 = local_f90 + 1;
              }
              local_f90 = local_f94 + local_f90;
            }
            local_f90 = local_f98 + local_f90;
          }
          if (*(int *)(in_RDI + 0xd0) == 0) {
            for (local_fa8 = 0; local_fa8 < local_c28; local_fa8 = local_fa8 + 1) {
              local_940 = &local_ff0;
              local_948 = &local_f08;
              local_7a0 = (void *)((long)local_f08.data +
                                  local_f08.cstep * (long)local_fa8 * local_f08.elemsize);
              local_788 = &local_ff0;
              local_4f0 = (long)local_f08.w * (long)local_f08.h * local_f08.elemsize;
              local_fb0 = (local_4f0 + 0xfU & 0xfffffffffffffff0) / local_f08.elemsize;
              local_fc8 = local_f08.dims + -1;
              if (local_f08.dims == 4) {
                local_fb0 = (long)local_f08.w * (long)local_f08.h;
              }
              local_960 = &local_1040;
              local_754 = *(int *)((long)local_c10 + 0x2c);
              local_758 = (int)local_c10[6];
              local_75c = *(undefined4 *)((long)local_c10 + 0x34);
              local_ff8 = *local_c10 + local_c10[8] * (long)local_fa8 * local_c10[2];
              local_770 = local_c10[2];
              local_774 = (undefined4)local_c10[3];
              local_780 = local_c10[4];
              local_750 = &local_1040;
              local_500 = (long)local_754 * (long)local_758 * local_770;
              local_8e0 = &local_1040;
              local_ad0 = &local_1040;
              local_fb8 = local_f08.d;
              local_fbc = 1;
              local_fc0 = local_f08.h;
              local_fc4 = local_f08.w;
              local_fd0 = local_f08.allocator;
              local_fd8 = local_f08.elempack;
              local_fe0 = local_f08.elemsize;
              local_fe8 = (int *)0x0;
              local_4f4 = 0x10;
              local_504 = 0x10;
              local_7a8 = local_f08.elemsize;
              local_7ac = local_f08.elempack;
              local_7b8 = local_f08.allocator;
              local_94c = local_fa8;
              local_94d = 1;
              local_96c = local_fa8;
              local_96d = 1;
              local_1040 = 0;
              local_1030 = 0;
              local_1028 = 0;
              local_1018 = 0;
              local_1014 = 0;
              local_1010 = 0;
              local_100c = 0;
              local_1008 = 0;
              local_1000 = 0;
              local_1038 = 0;
              local_768 = local_ff8;
              local_300 = local_ad0;
              local_1020 = local_780;
              local_ff0 = local_7a0;
              for (local_1044 = 0; local_1044 < local_f58; local_1044 = local_1044 + 1) {
                for (local_1048 = 0; local_1048 < local_f54; local_1048 = local_1048 + 1) {
                  for (local_104c = 0; local_104c < local_f50; local_104c = local_104c + 1) {
                    local_88c = local_1044 * *(int *)(in_RDI + 0xe8);
                    local_880 = &local_10a0;
                    local_888 = &local_ff0;
                    local_78 = (void *)((long)local_ff0 +
                                       (long)local_fc4 * (long)local_fc0 * (long)local_88c *
                                       local_fe0);
                    local_68 = &local_10a0;
                    local_854 = local_1048 * *(int *)(in_RDI + 0xe4);
                    local_850 = &local_10a0;
                    local_1058 = (float *)((long)local_78 +
                                          (long)(local_104c * *(int *)(in_RDI + 0xe0)) * 4 +
                                          (long)local_fc4 * (long)local_854 * local_fe0);
                    local_ac0 = &local_10a0;
                    local_1080 = local_fd0;
                    local_6c = local_fc4;
                    local_70 = local_fc0;
                    local_80 = local_fe0;
                    local_84 = local_fd8;
                    local_90 = local_fd0;
                    local_10a0 = 0;
                    local_1090 = 0;
                    local_1088 = 0;
                    local_1078 = 0;
                    local_1074 = 0;
                    local_1070 = 0;
                    local_106c = 0;
                    local_1068 = 0;
                    local_1060 = 0;
                    local_1098 = 0;
                    local_10a4 = *local_1058;
                    local_320 = local_ac0;
                    for (local_10a8 = 0; local_10a8 < local_f5c; local_10a8 = local_10a8 + 1) {
                      local_10ac = local_1058[local_f88[local_10a8]];
                      pfVar11 = std::max<float>(&local_10a4,&local_10ac);
                      local_10a4 = *pfVar11;
                    }
                    *(float *)(local_ff8 + (long)local_104c * 4) = local_10a4;
                  }
                  local_ff8 = local_ff8 + (long)local_f50 * 4;
                }
              }
              local_ab0 = &local_ff0;
              local_340 = local_ab0;
              if (local_fe8 != (int *)0x0) {
                local_344 = 0xffffffff;
                LOCK();
                local_348 = *local_fe8;
                *local_fe8 = *local_fe8 + -1;
                UNLOCK();
                if (local_348 == 1) {
                  if (local_fd0 == (Allocator *)0x0) {
                    local_158 = local_ff0;
                    if (local_ff0 != (void *)0x0) {
                      free(local_ff0);
                    }
                  }
                  else {
                    (*local_fd0->_vptr_Allocator[3])(local_fd0,local_ff0);
                  }
                }
              }
              local_ff0 = (void *)0x0;
              local_fe0 = 0;
              local_fd8 = 0;
              local_fc8 = 0;
              local_fc4 = 0;
              local_fc0 = 0;
              local_fbc = 0;
              local_fb8 = 0;
              local_fb0 = 0;
              local_fe8 = (int *)0x0;
            }
          }
          else if (*(int *)(in_RDI + 0xd0) == 1) {
            if (*(int *)(in_RDI + 0x10c) == 0) {
              local_10b0 = 0;
              local_10b4 = 0;
              local_10b8 = 0;
              if (*(int *)(in_RDI + 0x108) == 0) {
                local_10b0 = ((local_f08.w - *(int *)((long)local_c08 + 0x2c)) -
                             *(int *)(in_RDI + 0xec)) - *(int *)(in_RDI + 0xf0);
                local_10b4 = ((local_f08.h - (int)local_c08[6]) - *(int *)(in_RDI + 0xf4)) -
                             *(int *)(in_RDI + 0xf8);
                local_10b8 = ((local_f08.d - *(int *)((long)local_c08 + 0x34)) -
                             *(int *)(in_RDI + 0xfc)) - *(int *)(in_RDI + 0x100);
              }
              for (local_10bc = 0; local_10bc < local_c28; local_10bc = local_10bc + 1) {
                local_980 = &local_1108;
                local_988 = &local_f08;
                local_730 = (void *)((long)local_f08.data +
                                    local_f08.cstep * (long)local_10bc * local_f08.elemsize);
                local_718 = &local_1108;
                local_510 = (long)local_f08.w * (long)local_f08.h * local_f08.elemsize;
                local_9a0 = &local_1158;
                local_6e4 = *(int *)((long)local_c10 + 0x2c);
                local_6e8 = (int)local_c10[6];
                local_6ec = *(undefined4 *)((long)local_c10 + 0x34);
                local_6f8 = *local_c10 + local_c10[8] * (long)local_10bc * local_c10[2];
                local_700 = local_c10[2];
                local_704 = (undefined4)local_c10[3];
                local_710 = local_c10[4];
                local_6e0 = &local_1158;
                local_520 = (long)local_6e4 * (long)local_6e8 * local_700;
                local_8e8 = &local_1158;
                local_aa0 = &local_1158;
                local_10e8 = local_f08.allocator;
                local_514 = 0x10;
                local_524 = 0x10;
                local_738 = local_f08.elemsize;
                local_73c = local_f08.elempack;
                local_748 = local_f08.allocator;
                local_98c = local_10bc;
                local_98d = 1;
                local_9ac = local_10bc;
                local_9ad = 1;
                local_1158 = 0;
                local_1148 = 0;
                local_1140 = 0;
                local_1130 = 0;
                local_112c = 0;
                local_1128 = 0;
                local_1124 = 0;
                local_1120 = 0;
                local_1118 = 0;
                local_1150 = 0;
                local_1110 = local_6f8;
                for (local_115c = 0; local_115c < local_f58; local_115c = local_115c + 1) {
                  local_1160 = local_115c * *(int *)(in_RDI + 0xe8);
                  for (local_1164 = 0; local_1164 < local_f54; local_1164 = local_1164 + 1) {
                    local_1168 = local_1164 * *(int *)(in_RDI + 0xe4);
                    for (local_116c = 0; local_116c < local_f50; local_116c = local_116c + 1) {
                      local_1170 = local_116c * *(int *)(in_RDI + 0xe0);
                      local_1174 = 0.0;
                      local_1178 = 0;
                      for (local_117c = 0; local_117c < *(int *)(in_RDI + 0xdc);
                          local_117c = local_117c + 1) {
                        local_1180 = local_1160 + local_117c;
                        if (*(int *)(in_RDI + 0xfc) <= local_1180) {
                          if ((local_c24 - *(int *)(in_RDI + 0x100)) - local_10b8 <= local_1180)
                          break;
                          for (local_1184 = 0; local_1184 < *(int *)(in_RDI + 0xd8);
                              local_1184 = local_1184 + 1) {
                            local_1188 = local_1168 + local_1184;
                            if (*(int *)(in_RDI + 0xf4) <= local_1188) {
                              if ((local_c20 - *(int *)(in_RDI + 0xf8)) - local_10b4 <= local_1188)
                              break;
                              for (local_118c = 0; local_118c < *(int *)(in_RDI + 0xd4);
                                  local_118c = local_118c + 1) {
                                local_1190 = local_1170 + local_118c;
                                if (*(int *)(in_RDI + 0xec) <= local_1190) {
                                  if ((local_c1c - *(int *)(in_RDI + 0xf0)) - local_10b0 <=
                                      local_1190) break;
                                  local_898 = &local_11e0;
                                  local_8a0 = &local_1108;
                                  local_48 = (void *)((long)local_730 +
                                                     (long)local_f08.w * (long)local_f08.h *
                                                     (long)local_1180 * local_f08.elemsize);
                                  local_38 = &local_11e0;
                                  local_860 = &local_11e0;
                                  local_1194 = *(float *)((long)local_48 +
                                                         (long)local_1190 * 4 +
                                                         (long)local_f08.w * (long)local_1188 *
                                                         local_f08.elemsize);
                                  local_a90 = &local_11e0;
                                  local_11c0 = local_f08.allocator;
                                  local_3c = local_f08.w;
                                  local_40 = local_f08.h;
                                  local_50 = local_f08.elemsize;
                                  local_54 = local_f08.elempack;
                                  local_60 = local_f08.allocator;
                                  local_11e0 = 0;
                                  local_11d0 = 0;
                                  local_11c8 = 0;
                                  local_11b8 = 0;
                                  local_11b4 = 0;
                                  local_11b0 = 0;
                                  local_11ac = 0;
                                  local_11a8 = 0;
                                  local_11a0 = 0;
                                  local_11d8 = 0;
                                  local_1174 = local_1194 + local_1174;
                                  local_1178 = local_1178 + 1;
                                  local_8a4 = local_1180;
                                  local_864 = local_1188;
                                  local_380 = local_a90;
                                }
                              }
                            }
                          }
                        }
                      }
                      *(float *)(local_1110 + (long)local_116c * 4) = local_1174 / (float)local_1178
                      ;
                    }
                    local_1110 = local_1110 + (long)local_f50 * 4;
                  }
                }
                local_a80 = &local_1108;
                local_1108 = 0;
                local_10f8 = 0;
                local_10f0 = 0;
                local_10e0 = 0;
                local_10dc = 0;
                local_10d8 = 0;
                local_10d4 = 0;
                local_10d0 = 0;
                local_10c8 = 0;
                local_1100 = 0;
                local_3a0 = local_a80;
                local_360 = local_aa0;
                local_1138 = local_710;
              }
            }
            else {
              for (local_11e4 = 0; local_11e4 < local_c28; local_11e4 = local_11e4 + 1) {
                local_9c0 = &local_1230;
                local_9c8 = &local_f08;
                local_6c0 = (void *)((long)local_f08.data +
                                    local_f08.cstep * (long)local_11e4 * local_f08.elemsize);
                local_6a8 = &local_1230;
                local_530 = (long)local_f08.w * (long)local_f08.h * local_f08.elemsize;
                local_9e0 = &local_1280;
                local_674 = *(int *)((long)local_c10 + 0x2c);
                local_678 = (int)local_c10[6];
                local_67c = *(undefined4 *)((long)local_c10 + 0x34);
                local_688 = *local_c10 + local_c10[8] * (long)local_11e4 * local_c10[2];
                local_690 = local_c10[2];
                local_694 = (undefined4)local_c10[3];
                local_6a0 = local_c10[4];
                local_670 = &local_1280;
                local_540 = (long)local_674 * (long)local_678 * local_690;
                local_8f0 = &local_1280;
                local_a70 = &local_1280;
                local_1280 = 0;
                local_1270 = 0;
                local_1268 = 0;
                local_1258 = 0;
                local_1254 = 0;
                local_1250 = 0;
                local_124c = 0;
                local_1248 = 0;
                local_1240 = 0;
                local_1278 = 0;
                local_1238 = local_688;
                for (local_1284 = 0; local_1284 < local_f58; local_1284 = local_1284 + 1) {
                  for (local_1288 = 0; local_1288 < local_f54; local_1288 = local_1288 + 1) {
                    for (local_128c = 0; local_128c < local_f50; local_128c = local_128c + 1) {
                      local_8bc = local_1284 * *(int *)(in_RDI + 0xe8);
                      local_8b0 = &local_12e0;
                      local_8b8 = &local_1230;
                      local_c = local_f08.w;
                      local_10 = local_f08.h;
                      local_18 = (void *)((long)local_6c0 +
                                         (long)local_f08.w * (long)local_f08.h * (long)local_8bc *
                                         local_f08.elemsize);
                      local_20 = local_f08.elemsize;
                      local_24 = local_f08.elempack;
                      local_30 = local_f08.allocator;
                      local_8 = &local_12e0;
                      local_12c0 = local_f08.allocator;
                      local_874 = local_1288 * *(int *)(in_RDI + 0xe4);
                      local_870 = &local_12e0;
                      local_1298 = (long)local_18 +
                                   (long)(local_128c * *(int *)(in_RDI + 0xe0)) * 4 +
                                   (long)local_f08.w * (long)local_874 * local_f08.elemsize;
                      local_a60 = &local_12e0;
                      local_12e0 = 0;
                      local_12d0 = 0;
                      local_12c8 = 0;
                      local_12b8 = 0;
                      local_12b4 = 0;
                      local_12b0 = 0;
                      local_12ac = 0;
                      local_12a8 = 0;
                      local_12a0 = 0;
                      local_12d8 = 0;
                      local_12e4 = 0.0;
                      for (local_12e8 = 0; local_12e8 < local_f5c; local_12e8 = local_12e8 + 1) {
                        local_12e4 = *(float *)(local_1298 + (long)local_f88[local_12e8] * 4) +
                                     local_12e4;
                      }
                      *(float *)(local_1238 + (long)local_128c * 4) = local_12e4 / (float)local_f5c;
                      local_3e0 = local_a60;
                    }
                    local_1238 = local_1238 + (long)local_f50 * 4;
                  }
                }
                local_a50 = &local_1230;
                local_1210 = local_f08.allocator;
                local_534 = 0x10;
                local_544 = 0x10;
                local_6c8 = local_f08.elemsize;
                local_6cc = local_f08.elempack;
                local_6d8 = local_f08.allocator;
                local_9cc = local_11e4;
                local_9cd = 1;
                local_9ec = local_11e4;
                local_9ed = 1;
                local_1230 = 0;
                local_1220 = 0;
                local_1218 = 0;
                local_1208 = 0;
                local_1204 = 0;
                local_1200 = 0;
                local_11fc = 0;
                local_11f8 = 0;
                local_11f0 = 0;
                local_1228 = 0;
                local_400 = local_a50;
                local_3c0 = local_a70;
                local_1260 = local_6a0;
              }
            }
          }
          local_bf4 = 0;
          local_f4c = 1;
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea30);
        }
      }
      else {
        local_bf4 = -100;
        local_f4c = 1;
      }
      pMVar13 = &local_f08;
      if (local_f08.refcount != (int *)0x0) {
        local_424 = 0xffffffff;
        LOCK();
        local_428 = *local_f08.refcount;
        *local_f08.refcount = *local_f08.refcount + -1;
        UNLOCK();
        if (local_428 == 1) {
          local_a40 = pMVar13;
          local_420 = pMVar13;
          if (local_f08.allocator == (Allocator *)0x0) {
            local_e8 = local_f08.data;
            if (local_f08.data != (void *)0x0) {
              free(local_f08.data);
            }
          }
          else {
            (*(local_f08.allocator)->_vptr_Allocator[3])(local_f08.allocator,local_f08.data);
          }
        }
      }
      pMVar13->data = (void *)0x0;
      pMVar13->elemsize = 0;
      pMVar13->elempack = 0;
      pMVar13->dims = 0;
      pMVar13->w = 0;
      pMVar13->h = 0;
      pMVar13->d = 0;
      pMVar13->c = 0;
      pMVar13->cstep = 0;
      pMVar13->refcount = (int *)0x0;
    }
    else {
      local_135c = local_c1c;
      if (*(int *)(in_RDI + 0x114) != -0xe9) {
        local_135c = *(int *)(in_RDI + 0x114);
      }
      local_cfc = local_135c;
      local_1360 = local_c20;
      if (*(int *)(in_RDI + 0x118) != -0xe9) {
        local_1360 = *(int *)(in_RDI + 0x118);
      }
      local_d00 = local_1360;
      local_1364 = local_c24;
      if (*(int *)(in_RDI + 0x11c) != -0xe9) {
        local_1364 = *(int *)(in_RDI + 0x11c);
      }
      local_d04 = local_1364;
      if (((local_135c == local_c1c) && (local_1360 == local_c20)) && (local_1364 == local_c24)) {
        if (in_RDX != in_RSI) {
          if (in_RSI[1] != 0) {
            piVar1 = (int *)in_RSI[1];
            local_a0c = 1;
            LOCK();
            local_a10 = *piVar1;
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          local_a08 = in_RSI;
          if (in_RDX[1] != 0) {
            piVar1 = (int *)in_RDX[1];
            local_444 = 0xffffffff;
            LOCK();
            local_448 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_448 == 1) {
              if (in_RDX[4] == 0) {
                local_d8 = (void *)*in_RDX;
                if (local_d8 != (void *)0x0) {
                  free(local_d8);
                }
              }
              else {
                (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
              }
            }
          }
          *in_RDX = 0;
          in_RDX[2] = 0;
          *(undefined4 *)(in_RDX + 3) = 0;
          *(undefined4 *)(in_RDX + 5) = 0;
          *(undefined4 *)((long)in_RDX + 0x2c) = 0;
          *(undefined4 *)(in_RDX + 6) = 0;
          *(undefined4 *)((long)in_RDX + 0x34) = 0;
          *(undefined4 *)(in_RDX + 7) = 0;
          in_RDX[8] = 0;
          in_RDX[1] = 0;
          *in_RDX = *local_a08;
          in_RDX[1] = local_a08[1];
          in_RDX[2] = local_a08[2];
          *(int *)(in_RDX + 3) = (int)local_a08[3];
          in_RDX[4] = local_a08[4];
          *(int *)(in_RDX + 5) = (int)local_a08[5];
          *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_a08 + 0x2c);
          *(int *)(in_RDX + 6) = (int)local_a08[6];
          *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_a08 + 0x34);
          *(int *)(in_RDX + 7) = (int)local_a08[7];
          in_RDX[8] = local_a08[8];
        }
        local_bf4 = 0;
      }
      else {
        Mat::create(in_stack_ffffffffffffea40,iVar5,(int)in_stack_ffffffffffffea38,
                    (int)((ulong)in_stack_ffffffffffffea30 >> 0x20),(int)in_stack_ffffffffffffea30,
                    (size_t)in_stack_ffffffffffffea28,in_stack_ffffffffffffeaa0);
        local_be0 = local_c10;
        bVar12 = true;
        if (*local_c10 != 0) {
          local_840 = local_c10;
          bVar12 = local_c10[8] * (long)(int)local_c10[7] == 0;
        }
        if (bVar12) {
          local_bf4 = -100;
        }
        else {
          if (*(int *)(in_RDI + 0xd0) == 0) {
            for (local_d08 = 0; local_d08 < local_c28; local_d08 = local_d08 + 1) {
              local_ba8 = &local_d58;
              local_5cc = *(int *)((long)local_c08 + 0x2c);
              local_5d0 = (int)local_c08[6];
              local_5d4 = *(undefined4 *)((long)local_c08 + 0x34);
              local_d10 = *local_c08 + local_c08[8] * (long)local_d08 * local_c08[2];
              local_5e8 = local_c08[2];
              local_5ec = (undefined4)local_c08[3];
              local_5f8 = local_c08[4];
              local_5c8 = &local_d58;
              local_570 = (long)local_5cc * (long)local_5d0 * local_5e8;
              local_b68 = &local_d58;
              local_b10 = &local_d58;
              local_900 = &local_da8;
              local_7fc = *(int *)((long)local_c10 + 0x2c);
              local_800 = (int)local_c10[6];
              local_804 = *(undefined4 *)((long)local_c10 + 0x34);
              local_d60 = *local_c10 + local_c10[8] * (long)local_d08 * local_c10[2];
              local_818 = local_c10[2];
              local_81c = (undefined4)local_c10[3];
              local_828 = local_c10[4];
              local_7f8 = &local_da8;
              local_4d0 = (long)local_7fc * (long)local_800 * local_818;
              local_d20 = 0;
              local_d24 = 0;
              local_d28 = 0;
              local_d2c = 0;
              local_d40 = 0;
              local_d48 = 0;
              local_d50 = 0;
              local_d58 = 0;
              local_4d4 = 0x10;
              local_574 = 0x10;
              local_90c = local_d08;
              local_90d = 1;
              local_bb4 = local_d08;
              local_bb5 = 1;
              local_d18 = 0;
              local_d30 = 0;
              local_8d0 = &local_da8;
              local_b00 = &local_da8;
              local_da8 = 0;
              local_d98 = 0;
              local_d90 = 0;
              local_d80 = 0;
              local_d7c = 0;
              local_d78 = 0;
              local_d74 = 0;
              local_d70 = 0;
              local_d68 = 0;
              local_da0 = 0;
              local_810 = local_d60;
              local_5e0 = local_d10;
              local_2a0 = local_b00;
              local_280 = local_b10;
              local_d88 = local_828;
              local_d38 = local_5f8;
              for (local_dac = 0; local_dac < local_d04; local_dac = local_dac + 1) {
                local_db0 = (local_c24 * local_dac) / local_d04;
                local_db4 = (local_c24 * (local_dac + 1) + local_d04 + -1) / local_d04;
                for (local_db8 = 0; local_db8 < local_d00; local_db8 = local_db8 + 1) {
                  local_dbc = (local_c20 * local_db8) / local_d00;
                  local_dc0 = (local_c20 * (local_db8 + 1) + local_d00 + -1) / local_d00;
                  for (local_dc4 = 0; local_dc4 < local_cfc; local_dc4 = local_dc4 + 1) {
                    local_dc8 = (local_c1c * local_dc4) / local_cfc;
                    local_dcc = (local_c1c * (local_dc4 + 1) + local_cfc + -1) / local_cfc;
                    local_dd0 = *(float *)(local_d10 +
                                          (long)(local_db0 * local_c1c * local_c20 +
                                                 local_dbc * local_c1c + local_dc8) * 4);
                    for (local_dd4 = local_db0; local_dd4 < local_db4; local_dd4 = local_dd4 + 1) {
                      for (local_dd8 = local_dbc; local_dd8 < local_dc0; local_dd8 = local_dd8 + 1)
                      {
                        for (local_ddc = local_dc8; local_ddc < local_dcc; local_ddc = local_ddc + 1
                            ) {
                          pfVar11 = std::max<float>(&local_dd0,
                                                    (float *)(local_d10 +
                                                             (long)(local_dd4 * local_c1c *
                                                                    local_c20 +
                                                                    local_dd8 * local_c1c +
                                                                   local_ddc) * 4));
                          local_dd0 = *pfVar11;
                        }
                      }
                    }
                    *(float *)(local_d60 + (long)local_dc4 * 4) = local_dd0;
                  }
                  local_d60 = local_d60 + (long)local_cfc * 4;
                }
              }
            }
          }
          else if (*(int *)(in_RDI + 0xd0) == 1) {
            for (local_de0 = 0; local_de0 < local_c28; local_de0 = local_de0 + 1) {
              lVar2 = *local_c08;
              lVar3 = local_c08[8];
              lVar4 = local_c08[2];
              local_e38 = *local_c10 + local_c10[8] * (long)local_de0 * local_c10[2];
              for (local_e84 = 0; local_e84 < local_d04; local_e84 = local_e84 + 1) {
                iVar5 = (local_c24 * local_e84) / local_d04;
                iVar6 = (local_c24 * (local_e84 + 1) + local_d04 + -1) / local_d04;
                for (local_e94 = 0; local_e94 < local_d00; local_e94 = local_e94 + 1) {
                  iVar7 = (local_c20 * local_e94) / local_d00;
                  iVar8 = (local_c20 * (local_e94 + 1) + local_d00 + -1) / local_d00;
                  for (local_ea4 = 0; local_ea4 < local_cfc; local_ea4 = local_ea4 + 1) {
                    iVar9 = (local_c1c * local_ea4) / local_cfc;
                    iVar10 = (local_c1c * (local_ea4 + 1) + local_cfc + -1) / local_cfc;
                    local_eb4 = 0.0;
                    for (local_eb8 = iVar5; local_ebc = iVar7, local_eb8 < iVar6;
                        local_eb8 = local_eb8 + 1) {
                      for (; local_ec0 = iVar9, local_ebc < iVar8; local_ebc = local_ebc + 1) {
                        for (; local_ec0 < iVar10; local_ec0 = local_ec0 + 1) {
                          local_eb4 = *(float *)(lVar2 + lVar3 * local_de0 * lVar4 +
                                                (long)(local_eb8 * local_c1c * local_c20 +
                                                       local_ebc * local_c1c + local_ec0) * 4) +
                                      local_eb4;
                        }
                      }
                    }
                    *(float *)(local_e38 + (long)local_ea4 * 4) =
                         ((local_eb4 / (float)(iVar8 - iVar7)) / (float)(iVar10 - iVar9)) /
                         (float)(iVar6 - iVar5);
                  }
                  local_e38 = local_e38 + (long)local_cfc * 4;
                }
              }
            }
          }
          local_bf4 = 0;
        }
      }
    }
  }
  else {
    Mat::create(in_stack_ffffffffffffea40,iVar5,(size_t)in_stack_ffffffffffffea30,
                in_stack_ffffffffffffea28);
    local_bd8 = local_c10;
    bVar12 = true;
    if (*local_c10 != 0) {
      local_848 = local_c10;
      bVar12 = local_c10[8] * (long)(int)local_c10[7] == 0;
    }
    if (bVar12) {
      local_bf4 = -100;
    }
    else {
      local_c34 = local_c1c * local_c20 * local_c24;
      if (*(int *)(in_RDI + 0xd0) == 0) {
        for (local_c38 = 0; local_c38 < local_c28; local_c38 = local_c38 + 1) {
          local_b78 = &local_c88;
          local_63c = *(int *)((long)local_c08 + 0x2c);
          local_640 = (int)local_c08[6];
          local_644 = *(undefined4 *)((long)local_c08 + 0x34);
          local_c40 = (float *)(*local_c08 + local_c08[8] * (long)local_c38 * local_c08[2]);
          local_658 = local_c08[2];
          local_65c = (undefined4)local_c08[3];
          local_668 = local_c08[4];
          local_638 = &local_c88;
          local_550 = (long)local_63c * (long)local_640 * local_658;
          local_b58 = &local_c88;
          local_b30 = &local_c88;
          local_554 = 0x10;
          local_b84 = local_c38;
          local_b85 = 1;
          local_c88 = 0;
          local_c78 = 0;
          local_c70 = 0;
          local_c60 = 0;
          local_c5c = 0;
          local_c58 = 0;
          local_c54 = 0;
          local_c50 = 0;
          local_c48 = 0;
          local_c80 = 0;
          local_c98[0] = *local_c40;
          local_650 = local_c40;
          local_240 = local_b30;
          local_c68 = local_668;
          for (local_c9c = 0; local_c9c < local_c34; local_c9c = local_c9c + 1) {
            pfVar11 = std::max<float>(local_c98,local_c40 + local_c9c);
            local_c98[0] = *pfVar11;
          }
          local_a20 = (long)local_c38;
          *(float *)(*local_c10 + local_a20 * 4) = local_c98[0];
        }
      }
      else if (*(int *)(in_RDI + 0xd0) == 1) {
        for (local_ca0 = 0; local_ca0 < local_c28; local_ca0 = local_ca0 + 1) {
          local_cf4 = 0.0;
          for (local_cf8 = 0; local_cf8 < local_c34; local_cf8 = local_cf8 + 1) {
            local_cf4 = *(float *)(*local_c08 + local_c08[8] * (long)local_ca0 * local_c08[2] +
                                  (long)local_cf8 * 4) + local_cf4;
          }
          *(float *)(*local_c10 + (long)local_ca0 * 4) = local_cf4 / (float)local_c34;
        }
      }
      local_bf4 = 0;
    }
  }
  return local_bf4;
}

Assistant:

int Pooling3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h * d;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max_value = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max_value = std::max(max_value, ptr[i]);
                }

                top_blob[q] = max_value;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        int _out_w = out_w == -233 ? w : out_w;
        int _out_h = out_h == -233 ? h : out_h;
        int _out_d = out_d == -233 ? d : out_d;

        if (_out_w == w && _out_h == h && _out_d == d)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_out_w, _out_h, _out_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < _out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / _out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + _out_d - 1) / _out_d;
                    for (int i = 0; i < _out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / _out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                        for (int j = 0; j < _out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / _out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;

                            float max_value = inptr[id0 * w * h + ih0 * w + iw0];

                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        max_value = std::max(max_value, inptr[id * w * h + ih * w + iw]);
                                    }
                                }
                            }

                            outptr[j] = max_value;
                        }

                        outptr += _out_w;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < _out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / _out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + _out_d - 1) / _out_d;
                    int dk = id1 - id0;
                    for (int i = 0; i < _out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / _out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                        int hk = ih1 - ih0;
                        for (int j = 0; j < _out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / _out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;
                            int wk = iw1 - iw0;

                            float sum = 0;
                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        sum += inptr[id * w * h + ih * w + iw];
                                    }
                                }
                            }

                            outptr[j] = sum / hk / wk / dk;
                        }

                        outptr += _out_w;
                    }
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;
    int outd = (d - kernel_d) / stride_d + 1;

    top_blob.create(outw, outh, outd, channels, elemsize);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w - kernel_w;
        int gap1 = h * w - w * kernel_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += 1;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);
            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        float max_value = sptr[0];

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];
                            max_value = std::max(max_value, val);
                        }

                        outptr[j] = max_value;
                    }

                    outptr += outw;
                }
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;
            int dtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                dtailpad = bottom_blob_bordered.d - bottom_blob.d - pad_front - pad_behind;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    int sz0 = z * stride_d;

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            float sum = 0;
                            int area = 0;
                            for (int kd = 0; kd < kernel_d; kd++)
                            {
                                int sz = sz0 + kd;

                                if (sz < pad_front)
                                    continue;

                                if (sz >= d - pad_behind - dtailpad)
                                    break;

                                for (int ki = 0; ki < kernel_h; ki++)
                                {
                                    int sy = sy0 + ki;

                                    if (sy < pad_top)
                                        continue;

                                    if (sy >= h - pad_bottom - htailpad)
                                        break;

                                    for (int kj = 0; kj < kernel_w; kj++)
                                    {
                                        int sx = sx0 + kj;

                                        if (sx < pad_left)
                                            continue;

                                        if (sx >= w - pad_right - wtailpad)
                                            break;

                                        float val = m.depth(sz).row(sy)[sx];
                                        sum += val;
                                        area += 1;
                                    }
                                }
                            }

                            outptr[j] = sum / area;
                        }

                        outptr += outw;
                    }
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                            float sum = 0;

                            for (int l = 0; l < maxk; l++)
                            {
                                float val = sptr[space_ofs[l]];
                                sum += val;
                            }

                            outptr[j] = sum / maxk;
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}